

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::AllocateFunctionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  Var aValue;
  RecyclableObject *value;
  JavascriptString *name;
  JavascriptExternalFunction *result;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)40>
                       (evt);
    aValue = InflateVarInReplay(executeContext,pJVar1->VarArray[0]);
    if (aValue == (Var)0x0) {
      name = Js::JavascriptLibrary::GetEmptyString
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      if ((ulong)aValue >> 0x30 == 0) {
        value = Js::VarTo<Js::RecyclableObject>(aValue);
        if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          aValue = Js::CrossSite::MarshalVar(scriptContext,value,false);
        }
      }
      name = Js::JavascriptConversion::ToString(aValue,scriptContext);
    }
    result = Js::JavascriptLibrary::CreateStdCallExternalFunction
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                        Js::JavascriptExternalFunction::TTDReplayDummyExternalMethod,name,
                        (void *)0x0);
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)40>
              (executeContext,evt,result);
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void AllocateFunctionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::AllocateFunctionActionTag>(evt);

            Js::Var metadata = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::JavascriptString* name = nullptr;
            if(metadata != nullptr)
            {
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(metadata, ctx);
                name = Js::JavascriptConversion::ToString(metadata, ctx);
            }
            else
            {
                name = ctx->GetLibrary()->GetEmptyString();
            }

            Js::Var res = ctx->GetLibrary()->CreateStdCallExternalFunction(&Js::JavascriptExternalFunction::TTDReplayDummyExternalMethod, name, nullptr);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::AllocateFunctionActionTag>(executeContext, evt, res);
        }